

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int uv_encode(double u,double v,int em)

{
  int iVar1;
  int iVar2;
  int ui;
  int vi;
  int em_local;
  double v_local;
  double u_local;
  
  if ((NAN(u)) || (_vi = v, v_local = u, NAN(v))) {
    v_local = 0.210526316;
    _vi = 0.473684211;
  }
  if (0.016939999535679817 <= _vi) {
    iVar1 = tiff_itrunc((_vi - 0.016939999535679817) * 285.7142768952314,em);
    if (iVar1 < 0xa3) {
      if ((double)uv_row[iVar1].ustart <= v_local) {
        iVar2 = tiff_itrunc((v_local - (double)uv_row[iVar1].ustart) * 285.7142768952314,em);
        if (iVar2 < uv_row[iVar1].nus) {
          u_local._4_4_ = uv_row[iVar1].ncum + iVar2;
        }
        else {
          u_local._4_4_ = oog_encode(v_local,_vi);
        }
      }
      else {
        u_local._4_4_ = oog_encode(v_local,_vi);
      }
    }
    else {
      u_local._4_4_ = oog_encode(v_local,_vi);
    }
  }
  else {
    u_local._4_4_ = oog_encode(v_local,_vi);
  }
  return u_local._4_4_;
}

Assistant:

int
    uv_encode(double u, double v, int em) /* encode (u',v') coordinates */
{
    register int vi, ui;

    /* check for NaN */
    if (u != u || v != v)
    {
        u = U_NEU;
        v = V_NEU;
    }

    if (v < UV_VSTART)
        return oog_encode(u, v);
    vi = tiff_itrunc((v - UV_VSTART) * (1. / UV_SQSIZ), em);
    if (vi >= UV_NVS)
        return oog_encode(u, v);
    if (u < uv_row[vi].ustart)
        return oog_encode(u, v);
    ui = tiff_itrunc((u - uv_row[vi].ustart) * (1. / UV_SQSIZ), em);
    if (ui >= uv_row[vi].nus)
        return oog_encode(u, v);

    return (uv_row[vi].ncum + ui);
}